

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O1

bool __thiscall miniros::names::Path::startsWith(Path *this,Path *other)

{
  size_t sVar1;
  pointer pbVar2;
  size_t sVar3;
  pointer pbVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  size_t sVar8;
  size_t __n;
  ulong uVar9;
  char *__s2;
  char *__s1;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  
  if (this->m_absolute == other->m_absolute) {
    sVar1 = (other->m_lastName)._M_len;
    pbVar2 = (other->m_ns).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(other->m_ns).
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 4;
    uVar10 = (sVar1 != 0) + uVar9;
    sVar3 = (this->m_lastName)._M_len;
    pbVar4 = (this->m_ns).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(this->m_ns).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 4;
    if ((uVar12 + 1) - (ulong)(sVar3 == 0) < uVar10) {
      bVar14 = false;
    }
    else {
      bVar14 = uVar10 == 0;
      if (!bVar14) {
        pcVar5 = (this->m_lastName)._M_str;
        pcVar6 = (other->m_lastName)._M_str;
        lVar13 = 8;
        uVar11 = 0;
        do {
          __n = sVar3;
          __s1 = pcVar5;
          if (uVar12 != uVar11) {
            __n = 0;
            __s1 = (char *)0x0;
            if (uVar11 < uVar12) {
              __n = *(size_t *)((long)pbVar4 + lVar13 + -8);
              __s1 = *(char **)((long)&pbVar4->_M_len + lVar13);
            }
          }
          sVar8 = sVar1;
          __s2 = pcVar6;
          if (uVar9 != uVar11) {
            sVar8 = 0;
            __s2 = (char *)0x0;
            if (uVar11 < uVar9) {
              sVar8 = *(size_t *)((long)pbVar2 + lVar13 + -8);
              __s2 = *(char **)((long)&pbVar2->_M_len + lVar13);
            }
          }
          if (__n != sVar8) {
            return bVar14;
          }
          if ((__n != 0) && (iVar7 = bcmp(__s1,__s2,__n), iVar7 != 0)) {
            return bVar14;
          }
          uVar11 = uVar11 + 1;
          bVar14 = uVar10 <= uVar11;
          lVar13 = lVar13 + 0x10;
        } while (uVar10 != uVar11);
      }
    }
  }
  else {
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool Path::isAbsolute() const
{
  return m_absolute;
}